

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regfree.c
# Opt level: O1

void regfree(regex_t *__preg)

{
  int *__ptr;
  
  if (((*(int *)&__preg->buffer == 0xf265) && (__ptr = (int *)__preg->syntax, __ptr != (int *)0x0))
     && (*__ptr == 0xd245)) {
    *(undefined4 *)&__preg->buffer = 0;
    *__ptr = 0;
    if (*(void **)(__ptr + 2) != (void *)0x0) {
      free(*(void **)(__ptr + 2));
    }
    if (*(void **)(__ptr + 6) != (void *)0x0) {
      free(*(void **)(__ptr + 6));
    }
    if (*(void **)(__ptr + 8) != (void *)0x0) {
      free(*(void **)(__ptr + 8));
    }
    if (*(void **)(__ptr + 0x18) != (void *)0x0) {
      free(*(void **)(__ptr + 0x18));
    }
    free(__ptr);
    return;
  }
  return;
}

Assistant:

void
regfree(preg)
regex_t *preg;
{
	struct re_guts *g;

	if (preg->re_magic != MAGIC1)	/* oops */
		return;			/* nice to complain, but hard */

	g = preg->re_g;
	if (g == NULL || g->magic != MAGIC2)	/* oops again */
		return;
	preg->re_magic = 0;		/* mark it invalid */
	g->magic = 0;			/* mark it invalid */

	if (g->strip != NULL)
		free((char *)g->strip);
	if (g->sets != NULL)
		free((char *)g->sets);
	if (g->setbits != NULL)
		free((char *)g->setbits);
	if (g->must != NULL)
		free(g->must);
	free((char *)g);
}